

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O1

void __thiscall testing::internal::ExpectationBase::~ExpectationBase(ExpectationBase *this)

{
  pointer ppvVar1;
  pointer pcVar2;
  
  this->_vptr_ExpectationBase = (_func_int **)&PTR__ExpectationBase_001982b8;
  Mutex::~Mutex(&this->mutex_);
  ppvVar1 = (this->untyped_actions_).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar1 != (pointer)0x0) {
    operator_delete(ppvVar1);
  }
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)&this->immediate_prerequisites_);
  linked_ptr<const_testing::CardinalityInterface>::~linked_ptr(&(this->cardinality_).impl_);
  pcVar2 = (this->source_text_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->source_text_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

ExpectationBase::~ExpectationBase() {}